

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O0

UCharsTrieBuilder * __thiscall
icu_63::UCharsTrieBuilder::add
          (UCharsTrieBuilder *this,UnicodeString *s,int32_t value,UErrorCode *errorCode)

{
  int iVar1;
  undefined1 auVar2 [16];
  UBool UVar3;
  UMemory *this_00;
  UCharsTrieElement *pUVar4;
  UnicodeString *__src;
  UCharsTrieElement *local_68;
  UCharsTrieElement *newElements;
  int32_t newCapacity;
  UErrorCode *errorCode_local;
  int32_t value_local;
  UnicodeString *s_local;
  UCharsTrieBuilder *this_local;
  
  __src = s;
  UVar3 = ::U_FAILURE(*errorCode);
  if (UVar3 == '\0') {
    if (this->ucharsLength < 1) {
      if (this->elementsLength == this->elementsCapacity) {
        if (this->elementsCapacity == 0) {
          newElements._4_4_ = 0x400;
        }
        else {
          newElements._4_4_ = this->elementsCapacity << 2;
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)newElements._4_4_;
        this_00 = SUB168(auVar2 * ZEXT816(8),0);
        if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
          this_00 = (UMemory *)0xffffffffffffffff;
        }
        pUVar4 = (UCharsTrieElement *)UMemory::operator_new__(this_00,(size_t)__src);
        local_68 = (UCharsTrieElement *)0x0;
        if (pUVar4 != (UCharsTrieElement *)0x0) {
          local_68 = pUVar4;
        }
        if (local_68 == (UCharsTrieElement *)0x0) {
          *errorCode = U_MEMORY_ALLOCATION_ERROR;
          return this;
        }
        if (0 < this->elementsLength) {
          __src = (UnicodeString *)this->elements;
          memcpy(local_68,__src,(long)this->elementsLength << 3);
        }
        if (this->elements != (UCharsTrieElement *)0x0) {
          UMemory::operator_delete__((UMemory *)this->elements,__src);
        }
        this->elements = local_68;
        this->elementsCapacity = newElements._4_4_;
      }
      iVar1 = this->elementsLength;
      this->elementsLength = iVar1 + 1;
      UCharsTrieElement::setTo(this->elements + iVar1,s,value,&this->strings,errorCode);
      UVar3 = ::U_SUCCESS(*errorCode);
      if ((UVar3 != '\0') && (UVar3 = UnicodeString::isBogus(&this->strings), UVar3 != '\0')) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    else {
      *errorCode = U_NO_WRITE_PERMISSION;
    }
  }
  return this;
}

Assistant:

UCharsTrieBuilder &
UCharsTrieBuilder::add(const UnicodeString &s, int32_t value, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return *this;
    }
    if(ucharsLength>0) {
        // Cannot add elements after building.
        errorCode=U_NO_WRITE_PERMISSION;
        return *this;
    }
    if(elementsLength==elementsCapacity) {
        int32_t newCapacity;
        if(elementsCapacity==0) {
            newCapacity=1024;
        } else {
            newCapacity=4*elementsCapacity;
        }
        UCharsTrieElement *newElements=new UCharsTrieElement[newCapacity];
        if(newElements==NULL) {
            errorCode=U_MEMORY_ALLOCATION_ERROR;
            return *this;
        }
        if(elementsLength>0) {
            uprv_memcpy(newElements, elements, (size_t)elementsLength*sizeof(UCharsTrieElement));
        }
        delete[] elements;
        elements=newElements;
        elementsCapacity=newCapacity;
    }
    elements[elementsLength++].setTo(s, value, strings, errorCode);
    if(U_SUCCESS(errorCode) && strings.isBogus()) {
        errorCode=U_MEMORY_ALLOCATION_ERROR;
    }
    return *this;
}